

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_match.c
# Opt level: O3

int do_callout(heapframe *F,match_block_16 *mb,size_t *lengthptr)

{
  size_t *psVar1;
  PCRE2_UCHAR16 PVar2;
  _func_int_pcre2_callout_block_16_ptr_void_ptr *p_Var3;
  pcre2_callout_block_16 *ppVar4;
  size_t sVar5;
  int iVar6;
  PCRE2_SPTR16 pPVar7;
  ulong uVar8;
  uint32_t uVar9;
  size_t sVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined4 uVar13;
  
  pPVar7 = F->ecode;
  PVar2 = *pPVar7;
  if (PVar2 == 0x76) {
    uVar8 = 4;
  }
  else {
    uVar8 = (ulong)pPVar7[3];
  }
  *lengthptr = uVar8;
  p_Var3 = mb->callout;
  if (p_Var3 != (_func_int_pcre2_callout_block_16_ptr_void_ptr *)0x0) {
    psVar1 = &F->last_group_offset;
    ppVar4 = mb->cb;
    ppVar4->capture_top = ((uint)F->offset_top >> 1) + 1;
    ppVar4->capture_last = F->capture_last;
    ppVar4->offset_vector = psVar1;
    ppVar4->mark = mb->nomatch_mark;
    ppVar4->current_position = (long)F->eptr - (long)mb->start_subject >> 1;
    uVar11 = *(uint *)(pPVar7 + 1) & 0xffff;
    uVar13 = 0;
    auVar12._0_8_ = CONCAT44(uVar13,uVar11);
    auVar12._8_2_ = (short)(*(uint *)(pPVar7 + 1) >> 0x10);
    auVar12._10_6_ = 0;
    ppVar4->pattern_position = auVar12._0_8_;
    ppVar4->next_item_length = auVar12._8_8_;
    if (PVar2 == 0x76) {
      uVar9 = (uint32_t)pPVar7[3];
      ppVar4->callout_string_offset = 0;
      pPVar7 = (PCRE2_SPTR16)0x0;
      sVar10 = 0;
    }
    else {
      ppVar4->callout_string_offset = (ulong)pPVar7[4];
      pPVar7 = pPVar7 + 6;
      sVar10 = *lengthptr - 7;
      uVar9 = 0;
    }
    ppVar4->callout_number = uVar9;
    ppVar4->callout_string = pPVar7;
    ppVar4->callout_string_length = sVar10;
    sVar10 = *psVar1;
    sVar5 = F->offset_top;
    *(undefined4 *)psVar1 = 0xffffffff;
    *(undefined4 *)((long)&F->last_group_offset + 4) = 0xffffffff;
    *(undefined4 *)&F->offset_top = 0xffffffff;
    *(undefined4 *)((long)&F->offset_top + 4) = 0xffffffff;
    iVar6 = (*p_Var3)(ppVar4,mb->callout_data);
    *psVar1 = sVar10;
    F->offset_top = sVar5;
    ppVar4->callout_flags = 0;
    return iVar6;
  }
  return 0;
}

Assistant:

static int
do_callout(heapframe *F, match_block *mb, PCRE2_SIZE *lengthptr)
{
int rc;
PCRE2_SIZE save0, save1;
PCRE2_SIZE *callout_ovector;
pcre2_callout_block *cb;

*lengthptr = (*Fecode == OP_CALLOUT)?
  PRIV(OP_lengths)[OP_CALLOUT] : GET(Fecode, 1 + 2*LINK_SIZE);

if (mb->callout == NULL) return 0;   /* No callout function provided */

/* The original matching code (pre 10.30) worked directly with the ovector
passed by the user, and this was passed to callouts. Now that the working
ovector is in the backtracking frame, it no longer needs to reserve space for
the overall match offsets (which would waste space in the frame). For backward
compatibility, however, we pass capture_top and offset_vector to the callout as
if for the extended ovector, and we ensure that the first two slots are unset
by preserving and restoring their current contents. Picky compilers complain if
references such as Fovector[-2] are use directly, so we set up a separate
pointer. */

callout_ovector = (PCRE2_SIZE *)(Fovector) - 2;

/* The cb->version, cb->subject, cb->subject_length, and cb->start_match fields
are set externally. The first 3 never change; the last is updated for each
bumpalong. */

cb = mb->cb;
cb->capture_top      = (uint32_t)Foffset_top/2 + 1;
cb->capture_last     = Fcapture_last;
cb->offset_vector    = callout_ovector;
cb->mark             = mb->nomatch_mark;
cb->current_position = (PCRE2_SIZE)(Feptr - mb->start_subject);
cb->pattern_position = GET(Fecode, 1);
cb->next_item_length = GET(Fecode, 1 + LINK_SIZE);

if (*Fecode == OP_CALLOUT)  /* Numerical callout */
  {
  cb->callout_number = Fecode[1 + 2*LINK_SIZE];
  cb->callout_string_offset = 0;
  cb->callout_string = NULL;
  cb->callout_string_length = 0;
  }
else  /* String callout */
  {
  cb->callout_number = 0;
  cb->callout_string_offset = GET(Fecode, 1 + 3*LINK_SIZE);
  cb->callout_string = Fecode + (1 + 4*LINK_SIZE) + 1;
  cb->callout_string_length =
    *lengthptr - (1 + 4*LINK_SIZE) - 2;
  }

save0 = callout_ovector[0];
save1 = callout_ovector[1];
callout_ovector[0] = callout_ovector[1] = PCRE2_UNSET;
rc = mb->callout(cb, mb->callout_data);
callout_ovector[0] = save0;
callout_ovector[1] = save1;
cb->callout_flags = 0;
return rc;
}